

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.h
# Opt level: O1

Publisher __thiscall
miniros::NodeHandle::advertise<rosgraph_msgs::Clock_<std::allocator<void>>>
          (NodeHandle *this,string *topic,uint32_t queue_size,bool latch)

{
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  bool in_R8B;
  Publisher PVar1;
  AdvertiseOptions ops;
  _Any_data local_148;
  code *local_138;
  undefined8 uStack_130;
  _Any_data local_128;
  code *local_118;
  undefined8 uStack_110;
  AdvertiseOptions local_100;
  
  local_100.topic._M_dataplus._M_p = (pointer)&local_100.topic.field_2;
  local_100.topic._M_string_length = 0;
  local_100.topic.field_2._M_local_buf[0] = '\0';
  local_100.md5sum._M_dataplus._M_p = (pointer)&local_100.md5sum.field_2;
  local_100.md5sum._M_string_length = 0;
  local_100.md5sum.field_2._M_local_buf[0] = '\0';
  local_100.datatype._M_dataplus._M_p = (pointer)&local_100.datatype.field_2;
  local_100.datatype._M_string_length = 0;
  local_100.datatype.field_2._M_local_buf[0] = '\0';
  local_100.message_definition._M_dataplus._M_p = (pointer)&local_100.message_definition.field_2;
  local_100.message_definition._M_string_length = 0;
  local_100.message_definition.field_2._M_local_buf[0] = '\0';
  local_100.connect_cb.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_100.connect_cb.super__Function_base._M_functor._8_8_ = 0;
  local_100.connect_cb.super__Function_base._M_manager = (_Manager_type)0x0;
  local_100.connect_cb._M_invoker = (_Invoker_type)0x0;
  local_100.disconnect_cb.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_100.disconnect_cb.super__Function_base._M_functor._8_8_ = 0;
  local_100.disconnect_cb.super__Function_base._M_manager = (_Manager_type)0x0;
  local_100.disconnect_cb._M_invoker = (_Invoker_type)0x0;
  local_100.callback_queue = (CallbackQueueInterface *)0x0;
  local_100.tracked_object.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       0;
  local_100.tracked_object.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr._1_7_ =
       0;
  local_100.tracked_object.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_1_ = 0;
  local_100._217_8_ = 0;
  local_118 = (code *)0x0;
  uStack_110 = 0;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_138 = (code *)0x0;
  uStack_130 = 0;
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  AdvertiseOptions::init<rosgraph_msgs::Clock_<std::allocator<void>>>
            (&local_100,(string *)CONCAT44(in_register_00000014,queue_size),
             (uint32_t)CONCAT71(in_register_00000009,latch),(SubscriberStatusCallback *)&local_128,
             (SubscriberStatusCallback *)&local_148);
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,__destroy_functor);
  }
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  local_100.latch = in_R8B;
  miniros::NodeHandle::advertise((AdvertiseOptions *)this);
  AdvertiseOptions::~AdvertiseOptions(&local_100);
  PVar1.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar1.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Publisher)
         PVar1.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Publisher advertise(const std::string& topic, uint32_t queue_size, bool latch = false)
    {
      AdvertiseOptions ops;
      ops.template init<M>(topic, queue_size);
      ops.latch = latch;
      return advertise(ops);
    }